

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O1

bool __thiscall crnlib::crn_comp::quantize_images(crn_comp *this)

{
  uint uVar1;
  uint uVar2;
  crn_format cVar3;
  level_details *plVar4;
  color_quad<unsigned_char,_int> *pcVar5;
  float __x;
  int iVar6;
  uint uVar7;
  crn_comp_params *pcVar8;
  color_quad_u8 (*blocks) [16];
  uint uVar9;
  uint dy;
  uint uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  float *pfVar20;
  ulong uVar21;
  bool bVar22;
  uint uVar24;
  undefined1 auVar23 [16];
  uint uVar25;
  uint uVar26;
  undefined1 auVar27 [16];
  float fVar28;
  float fVar29;
  float local_1e4;
  uint y0;
  params local_188;
  
  dxt_hc::params::params(&local_188);
  pcVar8 = this->m_pParams;
  local_188.m_adaptive_tile_color_psnr_derating = pcVar8->m_crn_adaptive_tile_color_psnr_derating;
  local_188.m_adaptive_tile_alpha_psnr_derating = pcVar8->m_crn_adaptive_tile_alpha_psnr_derating;
  if ((pcVar8->m_flags & 0x40) == 0) {
    uVar10 = (pcVar8->m_height + 3 >> 2) * (pcVar8->m_width + 3 >> 2);
    if (0x1fff < uVar10) {
      uVar10 = 0x2000;
    }
    uVar11 = 8;
    if (8 < uVar10) {
      uVar11 = uVar10;
    }
    fVar28 = (float)pcVar8->m_quality_level / 255.0;
    fVar29 = 1.0;
    if (this->m_has_etc_color_blocks == true) {
      bVar22 = this->m_has_subblocks != false;
      if (bVar22) {
        fVar29 = 1.31;
        if (bVar22) goto LAB_001719d7;
LAB_00171a73:
        local_188.m_adaptive_tile_color_psnr_derating = 2.0;
      }
      else {
        fVar29 = 0.7;
        if (!bVar22) goto LAB_00171a73;
LAB_001719d7:
        local_188.m_adaptive_tile_color_psnr_derating = 5.0;
      }
    }
    __x = 1.0;
    if (fVar28 <= 1.0) {
      __x = fVar28;
    }
    cVar3 = pcVar8->m_format;
    if (cVar3 == cCRNFmtDXT5) {
      fVar29 = 0.75;
LAB_00171ac6:
      local_1e4 = 1.0;
    }
    else if (cVar3 == cCRNFmtETC2A) {
      local_1e4 = 0.9;
    }
    else {
      if (cVar3 != cCRNFmtDXT5_CCxY) goto LAB_00171ac6;
      local_188.m_adaptive_tile_color_psnr_derating = 5.0;
      fVar29 = 3.5;
      local_1e4 = 0.35;
    }
    fVar28 = powf(__x,fVar29 * 1.8);
    fVar29 = powf(__x,fVar29 * 1.65);
    fVar28 = fVar28 * (float)(int)(uVar11 - 0x40) + 64.0 + 0.5;
    fVar29 = fVar29 * (float)(int)(uVar11 - 0x60) + 96.0 + 0.5;
    uVar10 = (uint)fVar28;
    uVar24 = (uint)fVar29;
    uVar10 = (int)(fVar28 - 2.1474836e+09) & (int)uVar10 >> 0x1f | uVar10;
    uVar24 = (int)(fVar29 - 2.1474836e+09) & (int)uVar24 >> 0x1f | uVar24;
    uVar25 = -(uint)(-0x7fffe001 < (int)(uVar10 ^ 0x80000000));
    uVar26 = -(uint)(-0x7fffe001 < (int)(uVar24 ^ 0x80000000));
    uVar25 = uVar25 & 0x2000 | ~uVar25 & uVar10;
    uVar26 = uVar26 & 0x2000 | ~uVar26 & uVar24;
    uVar10 = -(uint)(-0x7ffffff8 < (int)(uVar25 ^ 0x80000000));
    uVar24 = -(uint)(-0x7ffffff8 < (int)(uVar26 ^ 0x80000000));
    local_188.m_color_selector_codebook_size = ~uVar24 & 8 | uVar26 & uVar24;
    local_188.m_color_endpoint_codebook_size = ~uVar10 & 8 | uVar25 & uVar10;
    fVar29 = powf(__x,local_1e4 * 2.1);
    fVar28 = powf(__x,local_1e4 * 1.65);
    local_188.m_alpha_endpoint_codebook_size =
         (uint)(long)((float)(int)(uVar11 - 0x18) * fVar29 + 24.0 + 0.5);
    if (0x1fff < local_188.m_alpha_endpoint_codebook_size) {
      local_188.m_alpha_endpoint_codebook_size = 0x2000;
    }
    if (local_188.m_alpha_endpoint_codebook_size < 9) {
      local_188.m_alpha_endpoint_codebook_size = 8;
    }
    uVar10 = (uint)(long)((float)(int)(uVar11 - 0x30) * fVar28 + 48.0 + 0.5);
    local_188.m_alpha_selector_codebook_size = 0x2000;
    if (uVar10 < 0x2000) {
      local_188.m_alpha_selector_codebook_size = uVar10;
    }
    if (local_188.m_alpha_selector_codebook_size < 9) {
      local_188.m_alpha_selector_codebook_size = 8;
    }
  }
  else {
    uVar21._0_4_ = pcVar8->m_crn_color_endpoint_palette_size;
    uVar21._4_4_ = pcVar8->m_crn_color_selector_palette_size;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar21;
    auVar27._0_4_ = -(uint)((int)(undefined4)uVar21 < (int)DAT_001ba570);
    auVar27._4_4_ = -(uint)((int)uVar21._4_4_ < DAT_001ba570._4_4_);
    auVar27._8_4_ = -(uint)(0 < DAT_001ba570._8_4_);
    auVar27._12_4_ = -(uint)(0 < DAT_001ba570._12_4_);
    auVar23 = ~auVar27 & _DAT_001ba570 | auVar23 & auVar27;
    uVar21 = CONCAT44(-(uint)(DAT_001b46f0._4_4_ < auVar23._4_4_),
                      -(uint)((int)DAT_001b46f0 < auVar23._0_4_));
    local_188._276_8_ = ~uVar21 & (ulong)DAT_001b46f0 | auVar23._0_8_ & uVar21;
    local_188.m_alpha_endpoint_codebook_size = pcVar8->m_crn_alpha_endpoint_palette_size;
    if (0x1fff < (int)local_188.m_alpha_endpoint_codebook_size) {
      local_188.m_alpha_endpoint_codebook_size = 0x2000;
    }
    if ((int)local_188.m_alpha_endpoint_codebook_size < 9) {
      local_188.m_alpha_endpoint_codebook_size = 8;
    }
    local_188.m_alpha_selector_codebook_size = 0x2000;
    if ((int)pcVar8->m_crn_alpha_selector_palette_size < 0x2000) {
      local_188.m_alpha_selector_codebook_size = pcVar8->m_crn_alpha_selector_palette_size;
    }
    if ((int)local_188.m_alpha_selector_codebook_size < 9) {
      local_188.m_alpha_selector_codebook_size = 8;
    }
  }
  if ((int)this->m_pParams->m_flags < 0) {
    console::debug("Color endpoints: %u",local_188._276_8_ & 0xffffffff);
    console::debug("Color selectors: %u",(ulong)local_188._276_8_ >> 0x20);
    console::debug("Alpha endpoints: %u",(ulong)local_188.m_alpha_endpoint_codebook_size);
    console::debug("Alpha selectors: %u");
  }
  pcVar8 = this->m_pParams;
  local_188.m_hierarchical = (bool)((byte)pcVar8->m_flags >> 1 & 1);
  local_188.m_perceptual = (bool)((byte)pcVar8->m_flags & 1);
  local_188.m_pProgress_func = pcVar8->m_pProgress_func;
  local_188.m_pProgress_func_data = pcVar8->m_pProgress_func_data;
  switch(pcVar8->m_format) {
  case cCRNFmtDXT1:
    local_188.m_format = cDXT1;
    break;
  case cCRNFmtDXT3:
    this->m_has_comp[1] = true;
    return false;
  case cCRNFmtDXT5:
    local_188.m_format = cDXT5;
    goto LAB_00171e55;
  case cCRNFmtDXT5_CCxY:
    local_188.m_format = cDXT5;
    local_188.m_alpha_component_indices[0] = 3;
    this->m_has_comp[0] = true;
    this->m_has_comp[1] = true;
    local_188.m_perceptual = false;
    local_188.m_adaptive_tile_color_alpha_weighting_ratio = 1.5;
    goto LAB_00171e6d;
  case cCRNFmtDXT5_xGxR:
  case cCRNFmtDXT5_xGBR:
  case cCRNFmtDXT5_AGBR:
    local_188.m_format = cDXT5;
    local_188.m_alpha_component_indices[0] = 3;
    this->m_has_comp[0] = true;
    this->m_has_comp[1] = true;
    goto LAB_00171e03;
  case cCRNFmtDXN_XY:
    local_188.m_format = cDXN_XY;
    local_188.m_alpha_component_indices[0] = 0;
    local_188.m_alpha_component_indices[1] = 1;
    goto LAB_00171dd5;
  case cCRNFmtDXN_YX:
    local_188.m_format = cDXN_YX;
    local_188.m_alpha_component_indices[0] = 1;
    local_188.m_alpha_component_indices[1] = 0;
LAB_00171dd5:
    this->m_has_comp[1] = true;
    this->m_has_comp[2] = true;
    goto LAB_00171e03;
  case cCRNFmtDXT5A:
    local_188.m_format = cDXT5A;
    local_188.m_alpha_component_indices[0] = pcVar8->m_alpha_component;
    this->m_has_comp[1] = true;
LAB_00171e03:
    local_188.m_perceptual = false;
    goto LAB_00171e6d;
  case cCRNFmtETC1:
    local_188.m_format = cETC1;
    break;
  case cCRNFmtETC2:
    local_188.m_format = cETC2;
    break;
  case cCRNFmtETC2A:
    local_188.m_format = cETC2A;
    goto LAB_00171e55;
  case cCRNFmtETC1S:
    local_188.m_format = cETC1S;
    break;
  case cCRNFmtETC2AS:
    local_188.m_format = cETC2AS;
LAB_00171e55:
    local_188.m_alpha_component_indices[0] = pcVar8->m_alpha_component;
    this->m_has_comp[0] = true;
    this->m_has_comp[1] = true;
    goto LAB_00171e6d;
  default:
    return false;
  }
  this->m_has_comp[0] = true;
LAB_00171e6d:
  local_188.m_debugging = SUB41(pcVar8->m_flags >> 0x1f,0);
  local_188.m_pTask_pool = &this->m_task_pool;
  local_188.m_num_levels = pcVar8->m_levels;
  pcVar8 = this->m_pParams;
  if (pcVar8->m_levels != 0) {
    lVar15 = 8;
    pfVar20 = &local_188.m_levels[0].m_weight;
    uVar21 = 0;
    do {
      plVar4 = (this->m_levels).m_p;
      ((anon_struct_16_4_e4b8e16b *)(pfVar20 + -3))->m_first_block =
           *(uint *)((long)plVar4 + lVar15 + -8);
      pfVar20[-2] = (float)*(uint *)((long)plVar4 + lVar15 + -4);
      pfVar20[-1] = (float)*(uint *)((long)&plVar4->first_block + lVar15);
      fVar28 = powf(1.3,(float)(uVar21 & 0xffffffff));
      fVar29 = 12.0;
      if (fVar28 <= 12.0) {
        fVar29 = fVar28;
      }
      *pfVar20 = fVar29;
      uVar21 = uVar21 + 1;
      pcVar8 = this->m_pParams;
      lVar15 = lVar15 + 0xc;
      pfVar20 = pfVar20 + 4;
    } while (uVar21 < pcVar8->m_levels);
  }
  local_188.m_num_faces = pcVar8->m_faces;
  local_188.m_num_blocks = this->m_total_blocks;
  blocks = (color_quad_u8 (*) [16])crnlib_malloc((ulong)(local_188.m_num_blocks << 4) << 2);
  if (this->m_pParams->m_levels != 0) {
    uVar21 = 0;
    uVar10 = 0;
    do {
      if (this->m_pParams->m_faces != 0) {
        uVar13 = 0;
        do {
          uVar1 = this->m_images[uVar13][uVar21].m_height;
          uVar11 = uVar1 + 7 >> 2 & 0x3ffffffe;
          if (uVar11 != 0) {
            uVar2 = this->m_images[uVar13][uVar21].m_width;
            uVar24 = uVar2 + 7 >> 2 & 0xfffffffe;
            uVar26 = uVar1 - 1;
            uVar19 = uVar2 - 1;
            uVar25 = 0;
            do {
              if (uVar24 != 0) {
                iVar14 = 0;
                uVar7 = 0;
                do {
                  iVar12 = 0;
                  iVar6 = 0;
                  do {
                    uVar17 = iVar12 + uVar25 * 4;
                    if (uVar26 <= uVar17) {
                      uVar17 = uVar26;
                    }
                    iVar16 = 0;
                    do {
                      uVar18 = iVar6 + iVar16;
                      uVar9 = iVar14 + iVar16;
                      if (uVar19 <= (uint)(iVar14 + iVar16)) {
                        uVar9 = uVar19;
                      }
                      pcVar5 = this->m_images[uVar13][uVar21].m_pPixels;
                      uVar9 = this->m_images[uVar13][uVar21].m_pitch * uVar17 + uVar9;
                      blocks[uVar10][uVar18].field_0.field_0.r = pcVar5[uVar9].field_0.field_0.r;
                      blocks[uVar10][uVar18].field_0.field_0.g = pcVar5[uVar9].field_0.field_0.g;
                      blocks[uVar10][uVar18].field_0.field_0.b = pcVar5[uVar9].field_0.field_0.b;
                      blocks[uVar10][uVar18].field_0.field_0.a = pcVar5[uVar9].field_0.field_0.a;
                      iVar16 = iVar16 + 1;
                    } while (iVar16 != 4);
                    iVar12 = iVar12 + 1;
                    iVar6 = iVar6 + 4;
                  } while (iVar12 != 4);
                  uVar7 = uVar7 + 1;
                  uVar10 = uVar10 + 1;
                  iVar14 = iVar14 + 4;
                } while (uVar7 != uVar24);
              }
              uVar25 = uVar25 + 1;
            } while (uVar25 != uVar11);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < this->m_pParams->m_faces);
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 < this->m_pParams->m_levels);
  }
  bVar22 = dxt_hc::compress(&this->m_hvq,blocks,&this->m_endpoint_indices,&this->m_selector_indices,
                            &this->m_color_endpoints,&this->m_alpha_endpoints,
                            &this->m_color_selectors,&this->m_alpha_selectors,&local_188);
  crnlib_free(blocks);
  return bVar22;
}

Assistant:

bool crn_comp::quantize_images() {
  dxt_hc::params params;

  params.m_adaptive_tile_alpha_psnr_derating = m_pParams->m_crn_adaptive_tile_alpha_psnr_derating;
  params.m_adaptive_tile_color_psnr_derating = m_pParams->m_crn_adaptive_tile_color_psnr_derating;

  if (m_pParams->m_flags & cCRNCompFlagManualPaletteSizes) {
    params.m_color_endpoint_codebook_size = math::clamp<int>(m_pParams->m_crn_color_endpoint_palette_size, cCRNMinPaletteSize, cCRNMaxPaletteSize);
    params.m_color_selector_codebook_size = math::clamp<int>(m_pParams->m_crn_color_selector_palette_size, cCRNMinPaletteSize, cCRNMaxPaletteSize);
    params.m_alpha_endpoint_codebook_size = math::clamp<int>(m_pParams->m_crn_alpha_endpoint_palette_size, cCRNMinPaletteSize, cCRNMaxPaletteSize);
    params.m_alpha_selector_codebook_size = math::clamp<int>(m_pParams->m_crn_alpha_selector_palette_size, cCRNMinPaletteSize, cCRNMaxPaletteSize);
  } else {
    uint max_codebook_entries = ((m_pParams->m_width + 3) / 4) * ((m_pParams->m_height + 3) / 4);

    max_codebook_entries = math::clamp<uint>(max_codebook_entries, cCRNMinPaletteSize, cCRNMaxPaletteSize);

    float quality = math::clamp<float>((float)m_pParams->m_quality_level / cCRNMaxQualityLevel, 0.0f, 1.0f);
    float color_quality_power_mul = 1.0f;
    float alpha_quality_power_mul = 1.0f;
    if (m_has_etc_color_blocks) {
      color_quality_power_mul = m_has_subblocks ? 1.31f : 0.7f;
      params.m_adaptive_tile_color_psnr_derating = m_has_subblocks ? 5.0f : 2.0f;
    }
    if (m_pParams->m_format == cCRNFmtDXT5_CCxY) {
      color_quality_power_mul = 3.5f;
      alpha_quality_power_mul = .35f;
      params.m_adaptive_tile_color_psnr_derating = 5.0f;
    } else if (m_pParams->m_format == cCRNFmtDXT5) {
      color_quality_power_mul = .75f;
    } else if (m_pParams->m_format == cCRNFmtETC2A) {
      alpha_quality_power_mul = .9f;
    }

    float color_endpoint_quality = powf(quality, 1.8f * color_quality_power_mul);
    float color_selector_quality = powf(quality, 1.65f * color_quality_power_mul);
    params.m_color_endpoint_codebook_size = math::clamp<uint>(math::float_to_uint(.5f + math::lerp<float>(math::maximum<float>(64, cCRNMinPaletteSize), (float)max_codebook_entries, color_endpoint_quality)), cCRNMinPaletteSize, cCRNMaxPaletteSize);
    params.m_color_selector_codebook_size = math::clamp<uint>(math::float_to_uint(.5f + math::lerp<float>(math::maximum<float>(96, cCRNMinPaletteSize), (float)max_codebook_entries, color_selector_quality)), cCRNMinPaletteSize, cCRNMaxPaletteSize);

    float alpha_endpoint_quality = powf(quality, 2.1f * alpha_quality_power_mul);
    float alpha_selector_quality = powf(quality, 1.65f * alpha_quality_power_mul);
    params.m_alpha_endpoint_codebook_size = math::clamp<uint>(math::float_to_uint(.5f + math::lerp<float>(math::maximum<float>(24, cCRNMinPaletteSize), (float)max_codebook_entries, alpha_endpoint_quality)), cCRNMinPaletteSize, cCRNMaxPaletteSize);    
    params.m_alpha_selector_codebook_size = math::clamp<uint>(math::float_to_uint(.5f + math::lerp<float>(math::maximum<float>(48, cCRNMinPaletteSize), (float)max_codebook_entries, alpha_selector_quality)), cCRNMinPaletteSize, cCRNMaxPaletteSize);
  }

  if (m_pParams->m_flags & cCRNCompFlagDebugging) {
    console::debug("Color endpoints: %u", params.m_color_endpoint_codebook_size);
    console::debug("Color selectors: %u", params.m_color_selector_codebook_size);
    console::debug("Alpha endpoints: %u", params.m_alpha_endpoint_codebook_size);
    console::debug("Alpha selectors: %u", params.m_alpha_selector_codebook_size);
  }

  params.m_hierarchical = (m_pParams->m_flags & cCRNCompFlagHierarchical) != 0;
  params.m_perceptual = (m_pParams->m_flags & cCRNCompFlagPerceptual) != 0;

  params.m_pProgress_func = m_pParams->m_pProgress_func;
  params.m_pProgress_func_data = m_pParams->m_pProgress_func_data;

  switch (m_pParams->m_format) {
    case cCRNFmtDXT1: {
      params.m_format = cDXT1;
      m_has_comp[cColor] = true;
      break;
    }
    case cCRNFmtDXT3: {
      m_has_comp[cAlpha0] = true;
      return false;
    }
    case cCRNFmtDXT5: {
      params.m_format = cDXT5;
      params.m_alpha_component_indices[0] = m_pParams->m_alpha_component;
      m_has_comp[cColor] = true;
      m_has_comp[cAlpha0] = true;
      break;
    }
    case cCRNFmtDXT5_CCxY: {
      params.m_format = cDXT5;
      params.m_alpha_component_indices[0] = 3;
      m_has_comp[cColor] = true;
      m_has_comp[cAlpha0] = true;
      params.m_perceptual = false;

      //params.m_adaptive_tile_color_alpha_weighting_ratio = 1.0f;
      params.m_adaptive_tile_color_alpha_weighting_ratio = 1.5f;
      break;
    }
    case cCRNFmtDXT5_xGBR:
    case cCRNFmtDXT5_AGBR:
    case cCRNFmtDXT5_xGxR: {
      params.m_format = cDXT5;
      params.m_alpha_component_indices[0] = 3;
      m_has_comp[cColor] = true;
      m_has_comp[cAlpha0] = true;
      params.m_perceptual = false;
      break;
    }
    case cCRNFmtDXN_XY: {
      params.m_format = cDXN_XY;
      params.m_alpha_component_indices[0] = 0;
      params.m_alpha_component_indices[1] = 1;
      m_has_comp[cAlpha0] = true;
      m_has_comp[cAlpha1] = true;
      params.m_perceptual = false;
      break;
    }
    case cCRNFmtDXN_YX: {
      params.m_format = cDXN_YX;
      params.m_alpha_component_indices[0] = 1;
      params.m_alpha_component_indices[1] = 0;
      m_has_comp[cAlpha0] = true;
      m_has_comp[cAlpha1] = true;
      params.m_perceptual = false;
      break;
    }
    case cCRNFmtDXT5A: {
      params.m_format = cDXT5A;
      params.m_alpha_component_indices[0] = m_pParams->m_alpha_component;
      m_has_comp[cAlpha0] = true;
      params.m_perceptual = false;
      break;
    }
    case cCRNFmtETC1: {
      params.m_format = cETC1;
      m_has_comp[cColor] = true;
      break;
    }
    case cCRNFmtETC2: {
      params.m_format = cETC2;
      m_has_comp[cColor] = true;
      break;
    }
    case cCRNFmtETC2A: {
      params.m_format = cETC2A;
      params.m_alpha_component_indices[0] = m_pParams->m_alpha_component;
      m_has_comp[cColor] = true;
      m_has_comp[cAlpha0] = true;
      break;
    }
    case cCRNFmtETC1S: {
      params.m_format = cETC1S;
      m_has_comp[cColor] = true;
      break;
    }
    case cCRNFmtETC2AS: {
      params.m_format = cETC2AS;
      params.m_alpha_component_indices[0] = m_pParams->m_alpha_component;
      m_has_comp[cColor] = true;
      m_has_comp[cAlpha0] = true;
      break;
    }
    default: {
      return false;
    }
  }
  params.m_debugging = (m_pParams->m_flags & cCRNCompFlagDebugging) != 0;
  params.m_pTask_pool = &m_task_pool;

  params.m_num_levels = m_pParams->m_levels;
  for (uint i = 0; i < m_pParams->m_levels; i++) {
    params.m_levels[i].m_first_block = m_levels[i].first_block;
    params.m_levels[i].m_num_blocks = m_levels[i].num_blocks;
    params.m_levels[i].m_block_width = m_levels[i].block_width;
    params.m_levels[i].m_weight = math::minimum(12.0f, powf(1.3f, (float)i));
  }
  params.m_num_faces = m_pParams->m_faces;
  params.m_num_blocks = m_total_blocks;
  color_quad_u8 (*blocks)[16] = (color_quad_u8(*)[16])crnlib_malloc(params.m_num_blocks * 16 * sizeof(color_quad_u8));
  for (uint b = 0, level = 0; level < m_pParams->m_levels; level++) {
    for (uint face = 0; face < m_pParams->m_faces; face++) {
      image_u8& image = m_images[face][level];
      uint width = image.get_width();
      uint height = image.get_height();
      uint blockWidth = ((width + 7) & ~7) >> 2;
      uint blockHeight = ((height + 7) & ~7) >> 2;
      for (uint by = 0; by < blockHeight; by++) {
        for (uint y0 = by << 2, bx = 0; bx < blockWidth; bx++, b++) {
          for (uint t = 0, x0 = bx << 2, dy = 0; dy < 4; dy++) {
            for (uint y = math::minimum<uint>(y0 + dy, height - 1), dx = 0; dx < 4; dx++, t++)
              blocks[b][t] = image(math::minimum<uint>(x0 + dx, width - 1), y);
          }
        }
      }
    }
  }
  bool result = m_hvq.compress(blocks, m_endpoint_indices, m_selector_indices, m_color_endpoints, m_alpha_endpoints, m_color_selectors, m_alpha_selectors, params);
  crnlib_free(blocks);

  return result;
}